

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerHLSL::emit_glsl_op
          (CompilerHLSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t count)

{
  BaseType BVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  GLSLstd450 op;
  SPIRType *pSVar5;
  CompilerError *this_00;
  uint32_t uVar6;
  uint32_t op2;
  char *pcVar7;
  BaseType input_type;
  
  uVar3 = CompilerGLSL::get_integer_width_for_glsl_instruction
                    (&this->super_CompilerGLSL,eop,args,count);
  uVar2 = uVar3 - 8 >> 3;
  uVar4 = uVar3 << 0x1d | uVar2;
  if ((7 < uVar4) || ((0x8bU >> (uVar2 & 0x1f) & 1) == 0)) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Invalid bit width.");
LAB_0017521a:
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  input_type = *(BaseType *)(&DAT_002f2568 + (ulong)uVar4 * 4);
  BVar1 = *(BaseType *)(&DAT_002f2588 + (ulong)uVar4 * 4);
  op = CompilerGLSL::get_remapped_glsl_op(&this->super_CompilerGLSL,eop);
  switch(op) {
  case GLSLstd450RoundEven:
    if ((this->hlsl_options).shader_model < 0x28) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"roundEven is not supported in HLSL shader model 2/3.");
      goto LAB_0017521a;
    }
    uVar3 = *args;
    pcVar7 = "round";
    break;
  case GLSLstd450Trunc:
    uVar3 = *args;
    pcVar7 = "trunc";
    break;
  default:
    goto switchD_00174c9b_caseD_4;
  case GLSLstd450Fract:
    uVar3 = *args;
    pcVar7 = "frac";
    break;
  case GLSLstd450Asinh:
  case GLSLstd450Acosh:
  case GLSLstd450Atanh:
    CompilerGLSL::emit_emulated_ahyper_op(&this->super_CompilerGLSL,result_type,id,*args,op);
    return;
  case GLSLstd450Atan2:
    uVar3 = *args;
    uVar6 = args[1];
    pcVar7 = "atan2";
    goto LAB_00174fd5;
  case GLSLstd450InverseSqrt:
    uVar3 = *args;
    pcVar7 = "rsqrt";
    break;
  case GLSLstd450MatrixInverse:
    pSVar5 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    uVar3 = pSVar5->vecsize;
    uVar6 = pSVar5->columns;
    if (uVar6 == 2 && uVar3 == 2) {
      if (this->requires_inverse_2x2 == false) {
        this->requires_inverse_2x2 = true;
        goto LAB_001751e5;
      }
    }
    else if (uVar6 == 3 && uVar3 == 3) {
      if (this->requires_inverse_3x3 == false) {
        this->requires_inverse_3x3 = true;
LAB_001751e5:
        Compiler::force_recompile((Compiler *)this);
      }
    }
    else if ((uVar6 == 4 && uVar3 == 4) && (this->requires_inverse_4x4 == false)) {
      this->requires_inverse_4x4 = true;
      goto LAB_001751e5;
    }
    uVar3 = *args;
    pcVar7 = "spvInverse";
    break;
  case GLSLstd450FMix:
  case GLSLstd450IMix:
    uVar3 = *args;
    uVar6 = args[1];
    op2 = args[2];
    pcVar7 = "lerp";
    goto LAB_00174e7d;
  case GLSLstd450Fma:
    uVar3 = *args;
    uVar6 = args[1];
    op2 = args[2];
    pcVar7 = "mad";
LAB_00174e7d:
    CompilerGLSL::emit_trinary_func_op
              (&this->super_CompilerGLSL,result_type,id,uVar3,uVar6,op2,pcVar7);
    return;
  case GLSLstd450PackSnorm4x8:
    if (this->requires_snorm8_packing == false) {
      this->requires_snorm8_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar3 = *args;
    pcVar7 = "spvPackSnorm4x8";
    break;
  case GLSLstd450PackUnorm4x8:
    if (this->requires_unorm8_packing == false) {
      this->requires_unorm8_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar3 = *args;
    pcVar7 = "spvPackUnorm4x8";
    break;
  case GLSLstd450PackSnorm2x16:
    if (this->requires_snorm16_packing == false) {
      this->requires_snorm16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar3 = *args;
    pcVar7 = "spvPackSnorm2x16";
    break;
  case GLSLstd450PackUnorm2x16:
    if (this->requires_unorm16_packing == false) {
      this->requires_unorm16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar3 = *args;
    pcVar7 = "spvPackUnorm2x16";
    break;
  case GLSLstd450PackHalf2x16:
    if (this->requires_fp16_packing == false) {
      this->requires_fp16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar3 = *args;
    pcVar7 = "spvPackHalf2x16";
    break;
  case GLSLstd450PackDouble2x32:
  case GLSLstd450UnpackDouble2x32:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"packDouble2x32/unpackDouble2x32 not supported in HLSL.");
    goto LAB_0017521a;
  case GLSLstd450UnpackSnorm2x16:
    if (this->requires_snorm16_packing == false) {
      this->requires_snorm16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar3 = *args;
    pcVar7 = "spvUnpackSnorm2x16";
    break;
  case GLSLstd450UnpackUnorm2x16:
    if (this->requires_unorm16_packing == false) {
      this->requires_unorm16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar3 = *args;
    pcVar7 = "spvUnpackUnorm2x16";
    break;
  case GLSLstd450UnpackHalf2x16:
    if (this->requires_fp16_packing == false) {
      this->requires_fp16_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar3 = *args;
    pcVar7 = "spvUnpackHalf2x16";
    break;
  case GLSLstd450UnpackSnorm4x8:
    if (this->requires_snorm8_packing == false) {
      this->requires_snorm8_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar3 = *args;
    pcVar7 = "spvUnpackSnorm4x8";
    break;
  case GLSLstd450UnpackUnorm4x8:
    if (this->requires_unorm8_packing == false) {
      this->requires_unorm8_packing = true;
      Compiler::force_recompile((Compiler *)this);
    }
    uVar3 = *args;
    pcVar7 = "spvUnpackUnorm4x8";
    break;
  case GLSLstd450Normalize:
    pSVar5 = Compiler::expression_type((Compiler *)this,*args);
    if (pSVar5->vecsize == 1) {
      uVar3 = *args;
      pcVar7 = "sign";
      break;
    }
    goto switchD_00174c9b_caseD_4;
  case GLSLstd450FaceForward:
    pSVar5 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar5->vecsize == 1) {
      if (this->requires_scalar_faceforward == false) {
        this->requires_scalar_faceforward = true;
        Compiler::force_recompile((Compiler *)this);
      }
      uVar3 = *args;
      uVar6 = args[1];
      op2 = args[2];
      pcVar7 = "spvFaceForward";
      goto LAB_00174e7d;
    }
    goto LAB_00175166;
  case GLSLstd450Reflect:
    pSVar5 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar5->vecsize == 1) {
      if (this->requires_scalar_reflect == false) {
        this->requires_scalar_reflect = true;
        Compiler::force_recompile((Compiler *)this);
      }
      uVar3 = *args;
      uVar6 = args[1];
      pcVar7 = "spvReflect";
      goto LAB_00174fd5;
    }
    goto LAB_00175166;
  case GLSLstd450Refract:
    pSVar5 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + result_type);
    if (pSVar5->vecsize == 1) {
      if (this->requires_scalar_refract == false) {
        this->requires_scalar_refract = true;
        Compiler::force_recompile((Compiler *)this);
      }
      uVar3 = *args;
      uVar6 = args[1];
      op2 = args[2];
      pcVar7 = "spvRefract";
      goto LAB_00174e7d;
    }
    goto LAB_00175166;
  case GLSLstd450FindILsb:
    pSVar5 = Compiler::expression_type((Compiler *)this,*args);
    input_type = pSVar5->basetype;
    uVar3 = *args;
    pcVar7 = "firstbitlow";
    goto LAB_0017511c;
  case GLSLstd450FindSMsb:
    uVar3 = *args;
    pcVar7 = "firstbithigh";
    goto LAB_0017511c;
  case GLSLstd450FindUMsb:
    uVar3 = *args;
    pcVar7 = "firstbithigh";
    input_type = BVar1;
LAB_0017511c:
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,result_type,id,uVar3,pcVar7,input_type,input_type);
    return;
  case GLSLstd450InterpolateAtCentroid:
    uVar3 = *args;
    pcVar7 = "EvaluateAttributeAtCentroid";
    break;
  case GLSLstd450InterpolateAtSample:
    uVar3 = *args;
    uVar6 = args[1];
    pcVar7 = "EvaluateAttributeAtSample";
    goto LAB_00174fd5;
  case GLSLstd450InterpolateAtOffset:
    uVar3 = *args;
    uVar6 = args[1];
    pcVar7 = "EvaluateAttributeSnapped";
LAB_00174fd5:
    CompilerGLSL::emit_binary_func_op(&this->super_CompilerGLSL,result_type,id,uVar3,uVar6,pcVar7);
    return;
  case GLSLstd450NMin:
    eop = 0x25;
    goto LAB_00175166;
  case GLSLstd450NMax:
    eop = 0x28;
    goto LAB_00175166;
  case GLSLstd450NClamp:
    eop = 0x2b;
LAB_00175166:
    CompilerGLSL::emit_glsl_op(&this->super_CompilerGLSL,result_type,id,eop,args,count);
    return;
  }
  CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,result_type,id,uVar3,pcVar7);
  return;
switchD_00174c9b_caseD_4:
  goto LAB_00175166;
}

Assistant:

void CompilerHLSL::emit_glsl_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args, uint32_t count)
{
	auto op = static_cast<GLSLstd450>(eop);

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_glsl_instruction(op, args, count);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	op = get_remapped_glsl_op(op);

	switch (op)
	{
	case GLSLstd450InverseSqrt:
		emit_unary_func_op(result_type, id, args[0], "rsqrt");
		break;

	case GLSLstd450Fract:
		emit_unary_func_op(result_type, id, args[0], "frac");
		break;

	case GLSLstd450RoundEven:
		if (hlsl_options.shader_model < 40)
			SPIRV_CROSS_THROW("roundEven is not supported in HLSL shader model 2/3.");
		emit_unary_func_op(result_type, id, args[0], "round");
		break;

	case GLSLstd450Trunc:
		emit_unary_func_op(result_type, id, args[0], "trunc");
		break;

	case GLSLstd450Acosh:
	case GLSLstd450Asinh:
	case GLSLstd450Atanh:
		// These are not supported in HLSL, always emulate them.
		emit_emulated_ahyper_op(result_type, id, args[0], op);
		break;

	case GLSLstd450FMix:
	case GLSLstd450IMix:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "lerp");
		break;

	case GLSLstd450Atan2:
		emit_binary_func_op(result_type, id, args[0], args[1], "atan2");
		break;

	case GLSLstd450Fma:
		emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "mad");
		break;

	case GLSLstd450InterpolateAtCentroid:
		emit_unary_func_op(result_type, id, args[0], "EvaluateAttributeAtCentroid");
		break;
	case GLSLstd450InterpolateAtSample:
		emit_binary_func_op(result_type, id, args[0], args[1], "EvaluateAttributeAtSample");
		break;
	case GLSLstd450InterpolateAtOffset:
		emit_binary_func_op(result_type, id, args[0], args[1], "EvaluateAttributeSnapped");
		break;

	case GLSLstd450PackHalf2x16:
		if (!requires_fp16_packing)
		{
			requires_fp16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvPackHalf2x16");
		break;

	case GLSLstd450UnpackHalf2x16:
		if (!requires_fp16_packing)
		{
			requires_fp16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvUnpackHalf2x16");
		break;

	case GLSLstd450PackSnorm4x8:
		if (!requires_snorm8_packing)
		{
			requires_snorm8_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvPackSnorm4x8");
		break;

	case GLSLstd450UnpackSnorm4x8:
		if (!requires_snorm8_packing)
		{
			requires_snorm8_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvUnpackSnorm4x8");
		break;

	case GLSLstd450PackUnorm4x8:
		if (!requires_unorm8_packing)
		{
			requires_unorm8_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvPackUnorm4x8");
		break;

	case GLSLstd450UnpackUnorm4x8:
		if (!requires_unorm8_packing)
		{
			requires_unorm8_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvUnpackUnorm4x8");
		break;

	case GLSLstd450PackSnorm2x16:
		if (!requires_snorm16_packing)
		{
			requires_snorm16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvPackSnorm2x16");
		break;

	case GLSLstd450UnpackSnorm2x16:
		if (!requires_snorm16_packing)
		{
			requires_snorm16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvUnpackSnorm2x16");
		break;

	case GLSLstd450PackUnorm2x16:
		if (!requires_unorm16_packing)
		{
			requires_unorm16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvPackUnorm2x16");
		break;

	case GLSLstd450UnpackUnorm2x16:
		if (!requires_unorm16_packing)
		{
			requires_unorm16_packing = true;
			force_recompile();
		}
		emit_unary_func_op(result_type, id, args[0], "spvUnpackUnorm2x16");
		break;

	case GLSLstd450PackDouble2x32:
	case GLSLstd450UnpackDouble2x32:
		SPIRV_CROSS_THROW("packDouble2x32/unpackDouble2x32 not supported in HLSL.");

	case GLSLstd450FindILsb:
	{
		auto basetype = expression_type(args[0]).basetype;
		emit_unary_func_op_cast(result_type, id, args[0], "firstbitlow", basetype, basetype);
		break;
	}

	case GLSLstd450FindSMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "firstbithigh", int_type, int_type);
		break;

	case GLSLstd450FindUMsb:
		emit_unary_func_op_cast(result_type, id, args[0], "firstbithigh", uint_type, uint_type);
		break;

	case GLSLstd450MatrixInverse:
	{
		auto &type = get<SPIRType>(result_type);
		if (type.vecsize == 2 && type.columns == 2)
		{
			if (!requires_inverse_2x2)
			{
				requires_inverse_2x2 = true;
				force_recompile();
			}
		}
		else if (type.vecsize == 3 && type.columns == 3)
		{
			if (!requires_inverse_3x3)
			{
				requires_inverse_3x3 = true;
				force_recompile();
			}
		}
		else if (type.vecsize == 4 && type.columns == 4)
		{
			if (!requires_inverse_4x4)
			{
				requires_inverse_4x4 = true;
				force_recompile();
			}
		}
		emit_unary_func_op(result_type, id, args[0], "spvInverse");
		break;
	}

	case GLSLstd450Normalize:
		// HLSL does not support scalar versions here.
		if (expression_type(args[0]).vecsize == 1)
		{
			// Returns -1 or 1 for valid input, sign() does the job.
			emit_unary_func_op(result_type, id, args[0], "sign");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Reflect:
		if (get<SPIRType>(result_type).vecsize == 1)
		{
			if (!requires_scalar_reflect)
			{
				requires_scalar_reflect = true;
				force_recompile();
			}
			emit_binary_func_op(result_type, id, args[0], args[1], "spvReflect");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450Refract:
		if (get<SPIRType>(result_type).vecsize == 1)
		{
			if (!requires_scalar_refract)
			{
				requires_scalar_refract = true;
				force_recompile();
			}
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvRefract");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450FaceForward:
		if (get<SPIRType>(result_type).vecsize == 1)
		{
			if (!requires_scalar_faceforward)
			{
				requires_scalar_faceforward = true;
				force_recompile();
			}
			emit_trinary_func_op(result_type, id, args[0], args[1], args[2], "spvFaceForward");
		}
		else
			CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;

	case GLSLstd450NMin:
		CompilerGLSL::emit_glsl_op(result_type, id, GLSLstd450FMin, args, count);
		break;

	case GLSLstd450NMax:
		CompilerGLSL::emit_glsl_op(result_type, id, GLSLstd450FMax, args, count);
		break;

	case GLSLstd450NClamp:
		CompilerGLSL::emit_glsl_op(result_type, id, GLSLstd450FClamp, args, count);
		break;

	default:
		CompilerGLSL::emit_glsl_op(result_type, id, eop, args, count);
		break;
	}
}